

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

BroadcastToDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_broadcasttodynamic(NeuralNetworkLayer *this)

{
  BroadcastToDynamicLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x456) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x456;
    this_00 = (BroadcastToDynamicLayerParams *)operator_new(0x18);
    BroadcastToDynamicLayerParams::BroadcastToDynamicLayerParams(this_00);
    (this->layer_).broadcasttodynamic_ = this_00;
  }
  return (BroadcastToDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BroadcastToDynamicLayerParams* NeuralNetworkLayer::mutable_broadcasttodynamic() {
  if (!has_broadcasttodynamic()) {
    clear_layer();
    set_has_broadcasttodynamic();
    layer_.broadcasttodynamic_ = new ::CoreML::Specification::BroadcastToDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.broadcastToDynamic)
  return layer_.broadcasttodynamic_;
}